

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

uint ON_SubDMeshFragment::DisplayDensityFromSideSegmentCount(uint side_segment_count)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0xffffffff;
  do {
    uVar2 = uVar2 + 1;
    uVar1 = 1 << ((byte)uVar2 & 0x1f);
    if (5 < uVar2) break;
  } while (uVar1 < side_segment_count);
  if (uVar1 != side_segment_count) {
    ON_SubDIncrementErrorCount();
  }
  return uVar2;
}

Assistant:

unsigned int ON_SubDMeshFragment::DisplayDensityFromSideSegmentCount(
  unsigned int side_segment_count
  )
{
  unsigned int display_density;
  for (display_density = 0; display_density < ON_SubDDisplayParameters::MaximumDensity; display_density++)
  {
    if ( 1U << display_density >= side_segment_count )
      break;
  }

  if ( 1U << display_density == side_segment_count )
    return display_density;

  return ON_SUBD_RETURN_ERROR(display_density);
}